

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeDataViewPrototype
               (DynamicObject *dataViewPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RuntimeFunction *pRVar2;
  RuntimeFunction *pRVar3;
  StaticType *type;
  LiteralString *pLVar4;
  
  DeferredTypeHandlerBase::Convert(typeHandler,dataViewPrototype,mode,2,0);
  this = (((dataViewPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (dataViewPrototype,0x67,(this->super_JavascriptLibraryBase).dataViewConstructor.ptr,6,0,
             0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetInt8,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1bb);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1bb,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetUint8,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1bc);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1bc,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetInt16,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1bd);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1bd,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetUint16,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1be);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1be,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetInt32,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1bf);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1bf,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetUint32,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c0);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c0,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetFloat32,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c1);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c1,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::SetFloat64,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c2);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c2,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetInt8,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c3);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c3,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetUint8,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c4);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c4,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetInt16,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c5);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c5,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetUint16,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c6);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c6,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetInt32,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c7);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c7,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetUint32,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c8);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c8,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetFloat32,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1c9);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1c9,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)DataView::EntryInfo::GetFloat64,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1ca);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(dataViewPrototype,0x1ca,pRVar2,6,0,0,0);
  pRVar3 = CreateGetterFunction(this,0x1aa,(FunctionInfo *)DataView::EntryInfo::GetterBuffer);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x2d])(dataViewPrototype,0x1aa,pRVar3,pRVar2,0);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3e])(dataViewPrototype,0x1aa,6);
  pRVar3 = CreateGetterFunction(this,0x1a9,(FunctionInfo *)DataView::EntryInfo::GetterByteLength);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x2d])(dataViewPrototype,0x1a9,pRVar3,pRVar2,0);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3e])(dataViewPrototype,0x1a9,6);
  pRVar3 = CreateGetterFunction(this,0x1a8,(FunctionInfo *)DataView::EntryInfo::GetterByteOffset);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x2d])(dataViewPrototype,0x1a8,pRVar3,pRVar2,0);
  (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3e])(dataViewPrototype,0x1a8,6);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar4 = LiteralString::New(type,L"DataView",8,this->recycler);
    (*(dataViewPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (dataViewPrototype,0x1b,pLVar4,2,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(dataViewPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDataViewPrototype(DynamicObject* dataViewPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(dataViewPrototype, mode, 2);

        ScriptContext* scriptContext = dataViewPrototype->GetScriptContext();
        JavascriptLibrary* library = dataViewPrototype->GetLibrary();
        library->AddMember(dataViewPrototype, PropertyIds::constructor, library->dataViewConstructor);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt8, &DataView::EntryInfo::SetInt8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint8, &DataView::EntryInfo::SetUint8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt16, &DataView::EntryInfo::SetInt16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint16, &DataView::EntryInfo::SetUint16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt32, &DataView::EntryInfo::SetInt32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint32, &DataView::EntryInfo::SetUint32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat32, &DataView::EntryInfo::SetFloat32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat64, &DataView::EntryInfo::SetFloat64, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt8, &DataView::EntryInfo::GetInt8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint8, &DataView::EntryInfo::GetUint8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt16, &DataView::EntryInfo::GetInt16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint16, &DataView::EntryInfo::GetUint16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt32, &DataView::EntryInfo::GetInt32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint32, &DataView::EntryInfo::GetUint32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat32, &DataView::EntryInfo::GetFloat32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat64, &DataView::EntryInfo::GetFloat64, 1);

        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::buffer, &DataView::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteLength, &DataView::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteOffset, &DataView::EntryInfo::GetterByteOffset, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(dataViewPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("DataView")), PropertyConfigurable);
        }

        dataViewPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }